

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O1

bool bssl::anon_unknown_0::ParseGeneralSubtrees
               (Input value,GeneralNames *subtrees,CertErrors *errors)

{
  bool bVar1;
  bool bVar2;
  CertErrors *in_R9;
  Input input;
  Input raw_general_name;
  Parser sequence_parser;
  Parser subtree_sequence;
  Input local_78;
  Parser local_60;
  Parser local_48;
  
  bssl::der::Parser::Parser(&local_60,value);
  bVar1 = bssl::der::Parser::HasMore(&local_60);
  if (bVar1) {
    do {
      bVar1 = bssl::der::Parser::HasMore(&local_60);
      if (!bVar1) break;
      bssl::der::Parser::Parser(&local_48);
      bVar2 = bssl::der::Parser::ReadSequence(&local_60,&local_48);
      if (!bVar2) goto LAB_004ae615;
      local_78.data_.data_ = (uchar *)0x0;
      local_78.data_.size_ = 0;
      bVar2 = bssl::der::Parser::ReadRawTLV(&local_48,&local_78);
      if (!bVar2) goto LAB_004ae615;
      input.data_.size_ = 1;
      input.data_.data_ = (uchar *)local_78.data_.size_;
      bVar2 = ParseGeneralName((bssl *)local_78.data_.data_,input,
                               (ParseGeneralNameIPAddressType)subtrees,(GeneralNames *)errors,in_R9)
      ;
      if (!bVar2) {
        CertErrors::AddError(errors,"Failed parsing GeneralName");
        goto LAB_004ae615;
      }
      bVar2 = bssl::der::Parser::HasMore(&local_48);
    } while (!bVar2);
    bVar1 = !bVar1;
  }
  else {
LAB_004ae615:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool ParseGeneralSubtrees(der::Input value,
                                        GeneralNames *subtrees,
                                        CertErrors *errors) {
  BSSL_CHECK(errors);

  // GeneralSubtrees ::= SEQUENCE SIZE (1..MAX) OF GeneralSubtree
  //
  // GeneralSubtree ::= SEQUENCE {
  //      base                    GeneralName,
  //      minimum         [0]     BaseDistance DEFAULT 0,
  //      maximum         [1]     BaseDistance OPTIONAL }
  //
  // BaseDistance ::= INTEGER (0..MAX)
  der::Parser sequence_parser(value);
  // The GeneralSubtrees sequence should have at least 1 element.
  if (!sequence_parser.HasMore()) {
    return false;
  }
  while (sequence_parser.HasMore()) {
    der::Parser subtree_sequence;
    if (!sequence_parser.ReadSequence(&subtree_sequence)) {
      return false;
    }

    der::Input raw_general_name;
    if (!subtree_sequence.ReadRawTLV(&raw_general_name)) {
      return false;
    }

    if (!ParseGeneralName(raw_general_name,
                          GeneralNames::IP_ADDRESS_AND_NETMASK, subtrees,
                          errors)) {
      errors->AddError(kFailedParsingGeneralName);
      return false;
    }

    // RFC 5280 section 4.2.1.10:
    // Within this profile, the minimum and maximum fields are not used with any
    // name forms, thus, the minimum MUST be zero, and maximum MUST be absent.
    // However, if an application encounters a critical name constraints
    // extension that specifies other values for minimum or maximum for a name
    // form that appears in a subsequent certificate, the application MUST
    // either process these fields or reject the certificate.

    // Note that technically failing here isn't required: rather only need to
    // fail if a name of this type actually appears in a subsequent cert and
    // this extension was marked critical. However the minimum and maximum
    // fields appear uncommon enough that implementing that isn't useful.
    if (subtree_sequence.HasMore()) {
      return false;
    }
  }
  return true;
}